

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::UTILS::PDU_Factory::applyFiltersBeforeDecodingPDUBody(PDU_Factory *this,Header *H)

{
  bool bVar1;
  reference ppPVar2;
  ulong uVar3;
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
  local_40;
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_*const_*,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
  local_38;
  const_iterator citrEnd;
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_*const_*,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
  local_28;
  const_iterator citr;
  Header *H_local;
  PDU_Factory *this_local;
  
  citr._M_current = (PDU_Factory_Filter **)H;
  citrEnd._M_current =
       (PDU_Factory_Filter **)
       std::
       vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
       ::begin(&this->m_vFilters);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
  ::__normal_iterator<KDIS::UTILS::PDU_Factory_Filter**>
            ((__normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
              *)&local_28,
             (__normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
              *)&citrEnd);
  local_40._M_current =
       (PDU_Factory_Filter **)
       std::
       vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
       ::end(&this->m_vFilters);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
  ::__normal_iterator<KDIS::UTILS::PDU_Factory_Filter**>
            ((__normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
              *)&local_38,&local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      return true;
    }
    ppPVar2 = __gnu_cxx::
              __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_*const_*,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
              ::operator*(&local_28);
    uVar3 = (**(code **)(*(long *)*ppPVar2 + 0x10))(*ppPVar2,citr._M_current);
    if ((uVar3 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_*const_*,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
    ::operator++(&local_28);
  }
  return false;
}

Assistant:

KBOOL PDU_Factory::applyFiltersBeforeDecodingPDUBody( const Header * H )
{
    // Test all the filters
    vector<PDU_Factory_Filter*>::const_iterator citr = m_vFilters.begin();
    vector<PDU_Factory_Filter*>::const_iterator citrEnd = m_vFilters.end();

    for (; citr != citrEnd; ++citr)
    {
        if (!(*citr)->ApplyFilterBeforeDecodingPDUBody(H))
        {
            return false;
        }
    }

    return true;
}